

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void arb1_MxXy(Context *ctx,int x,int y)

{
  size_t idx;
  uint uVar1;
  uint uVar2;
  char *in_RCX;
  size_t buflen;
  size_t sVar3;
  char src0 [64];
  char row [64];
  char dst [64];
  char local_f8 [64];
  char local_b8 [64];
  char local_78 [72];
  
  uVar1 = (ctx->dest_arg).writemask;
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_f8,(size_t)in_RCX);
  if (0 < y) {
    sVar3 = 0;
    do {
      idx = sVar3 + 1;
      make_ARB1_srcarg_string(ctx,idx,local_b8,(size_t)in_RCX);
      uVar2 = 1 << ((byte)sVar3 & 0x1f);
      (ctx->dest_arg).writemask = uVar2;
      (ctx->dest_arg).writemask0 = uVar2 & 1;
      (ctx->dest_arg).writemask1 = (uint)(sVar3 == 1);
      (ctx->dest_arg).writemask2 = (uint)(sVar3 == 2);
      (ctx->dest_arg).writemask3 = (uint)(sVar3 == 3);
      make_ARB1_destarg_string(ctx,local_78,buflen);
      in_RCX = local_78;
      output_line(ctx,"DP%d%s, %s, %s;",(ulong)(uint)x,local_78,local_f8,local_b8);
      sVar3 = idx;
    } while ((uint)y != idx);
  }
  (ctx->dest_arg).writemask = uVar1;
  (ctx->dest_arg).writemask0 = uVar1 & 1;
  (ctx->dest_arg).writemask1 = uVar1 >> 1 & 1;
  (ctx->dest_arg).writemask2 = uVar1 >> 2 & 1;
  (ctx->dest_arg).writemask3 = uVar1 >> 3 & 1;
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

EMIT_ARB1_OPCODE_DS_FUNC(FRC)

static void arb1_MxXy(Context *ctx, const int x, const int y)
{
    DestArgInfo *dstarg = &ctx->dest_arg;
    const int origmask = dstarg->writemask;
    char src0[64];
    int i;

    make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));

    for (i = 0; i < y; i++)
    {
        char dst[64];
        char row[64];
        make_ARB1_srcarg_string(ctx, i + 1, row, sizeof (row));
        set_dstarg_writemask(dstarg, 1 << i);
        make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        output_line(ctx, "DP%d%s, %s, %s;", x, dst, src0, row);
    } // for

    set_dstarg_writemask(dstarg, origmask);
    emit_ARB1_dest_modifiers(ctx);
}